

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void h_predictor_32xh(uint8_t *dst,ptrdiff_t stride,uint8_t *left,int height)

{
  undefined4 uVar1;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  int local_178;
  uint8_t *local_170;
  uint8_t *local_160;
  undefined1 local_128;
  undefined1 uStack_127;
  undefined1 uStack_126;
  undefined1 uStack_125;
  __m128i r3;
  __m128i r2;
  __m128i r1;
  __m128i r0;
  __m128i left4;
  int i;
  int height_local;
  uint8_t *left_local;
  ptrdiff_t stride_local;
  uint8_t *dst_local;
  
  local_178 = height >> 2;
  local_170 = left;
  local_160 = dst;
  do {
    uVar1 = *(undefined4 *)local_170;
    local_128 = (undefined1)uVar1;
    uStack_127 = (undefined1)((uint)uVar1 >> 8);
    uStack_126 = (undefined1)((uint)uVar1 >> 0x10);
    uStack_125 = (undefined1)((uint)uVar1 >> 0x18);
    local_188 = CONCAT13(local_128,CONCAT12(local_128,CONCAT11(local_128,local_128)));
    _local_188 = CONCAT17(uStack_127,
                          CONCAT16(uStack_127,CONCAT15(uStack_127,CONCAT14(uStack_127,local_188))));
    uStack_180 = CONCAT13(uStack_126,CONCAT12(uStack_126,CONCAT11(uStack_126,uStack_126)));
    _uStack_180 = CONCAT17(uStack_125,
                           CONCAT16(uStack_125,CONCAT15(uStack_125,CONCAT14(uStack_125,uStack_180)))
                          );
    *(ulong *)local_160 = CONCAT44(local_188,local_188);
    *(ulong *)(local_160 + 8) = CONCAT44(local_188,local_188);
    *(ulong *)(local_160 + 0x10) = CONCAT44(local_188,local_188);
    *(ulong *)(local_160 + 0x18) = CONCAT44(local_188,local_188);
    *(ulong *)(local_160 + stride) = CONCAT44(uStack_184,uStack_184);
    *(ulong *)(local_160 + stride + 8) = CONCAT44(uStack_184,uStack_184);
    *(ulong *)(local_160 + stride + 0x10) = CONCAT44(uStack_184,uStack_184);
    *(ulong *)(local_160 + stride + 0x10 + 8) = CONCAT44(uStack_184,uStack_184);
    *(ulong *)(local_160 + stride * 2) = CONCAT44(uStack_180,uStack_180);
    *(ulong *)(local_160 + stride * 2 + 8) = CONCAT44(uStack_180,uStack_180);
    *(ulong *)(local_160 + stride * 2 + 0x10) = CONCAT44(uStack_180,uStack_180);
    *(ulong *)(local_160 + stride * 2 + 0x18) = CONCAT44(uStack_180,uStack_180);
    *(ulong *)(local_160 + stride * 3) = CONCAT44(uStack_17c,uStack_17c);
    *(ulong *)(local_160 + stride * 3 + 8) = CONCAT44(uStack_17c,uStack_17c);
    *(ulong *)(local_160 + stride * 3 + 0x10) = CONCAT44(uStack_17c,uStack_17c);
    *(ulong *)(local_160 + stride * 3 + 0x18) = CONCAT44(uStack_17c,uStack_17c);
    local_170 = local_170 + 4;
    local_160 = local_160 + stride * 4;
    local_178 = local_178 + -1;
  } while (local_178 != 0);
  return;
}

Assistant:

static inline void h_predictor_32xh(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *left, int height) {
  int i = height >> 2;
  do {
    __m128i left4 = _mm_cvtsi32_si128(((int *)left)[0]);
    left4 = _mm_unpacklo_epi8(left4, left4);
    left4 = _mm_unpacklo_epi8(left4, left4);
    const __m128i r0 = _mm_shuffle_epi32(left4, 0x0);
    const __m128i r1 = _mm_shuffle_epi32(left4, 0x55);
    _mm_store_si128((__m128i *)dst, r0);
    _mm_store_si128((__m128i *)(dst + 16), r0);
    _mm_store_si128((__m128i *)(dst + stride), r1);
    _mm_store_si128((__m128i *)(dst + stride + 16), r1);
    const __m128i r2 = _mm_shuffle_epi32(left4, 0xaa);
    const __m128i r3 = _mm_shuffle_epi32(left4, 0xff);
    _mm_store_si128((__m128i *)(dst + stride * 2), r2);
    _mm_store_si128((__m128i *)(dst + stride * 2 + 16), r2);
    _mm_store_si128((__m128i *)(dst + stride * 3), r3);
    _mm_store_si128((__m128i *)(dst + stride * 3 + 16), r3);
    left += 4;
    dst += stride * 4;
  } while (--i);
}